

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sstream.cpp
# Opt level: O2

void __thiscall string_stream_to_string_Test::TestBody(string_stream_to_string_Test *this)

{
  char *pcVar1;
  buffer<char> local_290;
  AssertionResult gtest_ar;
  char latin1 [5];
  AssertionResult gtest_ar_1;
  string_stream ss2;
  string_stream ss;
  
  latin1[4] = '\0';
  latin1[0] = ' ';
  latin1[1] = '~';
  latin1[2] = -0x60;
  latin1[3] = -1;
  ss.m_chars = ss.m_stack;
  ss.m_alloc = 0x100;
  ss.m_size = 0;
  ST::string_stream::append(&ss,latin1,0xffffffffffffffff);
  ST::string::from_latin_1((string *)&ss2,latin1,0xffffffffffffffff);
  ST::string::from_latin_1((string *)&local_290,ss.m_chars,ss.m_size);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            ((internal *)&gtest_ar,"ST::string::from_latin_1(latin1)","ss.to_string(false)",
             (string *)&ss2,(string *)&local_290);
  ST::buffer<char>::~buffer(&local_290);
  ST::buffer<char>::~buffer((buffer<char> *)&ss2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&ss2);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_sstream.cpp"
               ,0x91,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_290,(Message *)&ss2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_290);
    if (ss2.m_chars != (char *)0x0) {
      (**(code **)(*(long *)ss2.m_chars + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  ss2.m_chars = ss2.m_stack;
  ss2.m_alloc = 0x100;
  ss2.m_size = 0;
  ST::string_stream::append(&ss2,TestBody::utf8_test_data,0xffffffffffffffff);
  ST::string::from_utf8
            ((string *)&local_290,TestBody::utf8_test_data,0xffffffffffffffff,check_validity);
  ST::string::from_utf8((string *)&gtest_ar,ss2.m_chars,ss2.m_size,check_validity);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            ((internal *)&gtest_ar_1,"ST::string::from_utf8(utf8_test_data)","ss2.to_string(true)",
             (string *)&local_290,(string *)&gtest_ar);
  ST::buffer<char>::~buffer((buffer<char> *)&gtest_ar);
  ST::buffer<char>::~buffer(&local_290);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_290);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar_1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_sstream.cpp"
               ,0x95,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    if ((long *)local_290.m_chars != (long *)0x0) {
      (**(code **)(*(long *)local_290.m_chars + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_1.message_);
  ST::string_stream::~string_stream(&ss2);
  ST::string_stream::~string_stream(&ss);
  return;
}

Assistant:

TEST(string_stream, to_string)
{
    const char latin1[] = "\x20\x7e\xa0\xff";
    static const char utf8_test_data[] =
        "\x20"              "\x7f"
        "\xc3\xbf"          "\xc4\x80"
        "\xe7\xbf\xbf"
        "\xef\xbf\xbf"      "\xf0\x90\x80\x80"
        "\xf0\x90\x80\xa0"  "\xf1\x80\x80\x80"
        "\xf4\x8f\xbf\xbf";

    ST::string_stream ss;
    ss.append(latin1);
    EXPECT_EQ(ST::string::from_latin_1(latin1), ss.to_string(false));

    ST::string_stream ss2;
    ss2.append(utf8_test_data);
    EXPECT_EQ(ST::string::from_utf8(utf8_test_data), ss2.to_string(true));
}